

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O0

Hop_Obj_t * Hop_Oper(Hop_Man_t *p,Hop_Obj_t *p0,Hop_Obj_t *p1,Hop_Type_t Type)

{
  Hop_Type_t Type_local;
  Hop_Obj_t *p1_local;
  Hop_Obj_t *p0_local;
  Hop_Man_t *p_local;
  
  if (Type == AIG_AND) {
    p_local = (Hop_Man_t *)Hop_And(p,p0,p1);
  }
  else {
    if (Type != AIG_EXOR) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopOper.c"
                    ,0x59,"Hop_Obj_t *Hop_Oper(Hop_Man_t *, Hop_Obj_t *, Hop_Obj_t *, Hop_Type_t)");
    }
    p_local = (Hop_Man_t *)Hop_Exor(p,p0,p1);
  }
  return (Hop_Obj_t *)p_local;
}

Assistant:

Hop_Obj_t * Hop_Oper( Hop_Man_t * p, Hop_Obj_t * p0, Hop_Obj_t * p1, Hop_Type_t Type )
{
    if ( Type == AIG_AND )
        return Hop_And( p, p0, p1 );
    if ( Type == AIG_EXOR )
        return Hop_Exor( p, p0, p1 );
    assert( 0 );
    return NULL;
}